

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_job_pool.hpp
# Opt level: O0

mmap_disk_job * __thiscall
libtorrent::aux::disk_job_pool<libtorrent::aux::mmap_disk_job>::
allocate_job<libtorrent::aux::job::hash,std::shared_ptr<libtorrent::aux::mmap_storage>,std::function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,libtorrent::span<libtorrent::digest32<256l>>const&,libtorrent::digest32<160l>>
          (disk_job_pool<libtorrent::aux::mmap_disk_job> *this,disk_job_flags_t flags,
          shared_ptr<libtorrent::aux::mmap_storage> *stor,
          function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&)>
          *args,strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *args_1,
          span<libtorrent::digest32<256L>_> *args_2,digest32<160L> *args_3)

{
  mmap_disk_job *pmVar1;
  mutex *__m;
  hash local_130;
  tailqueue_node<libtorrent::aux::disk_job> local_e0;
  undefined1 local_d8 [144];
  mmap_disk_job *local_48;
  element_type *ptr;
  lock_guard<std::mutex> l;
  span<libtorrent::digest32<256L>_> *args_local_2;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *args_local_1;
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&)>
  *args_local;
  shared_ptr<libtorrent::aux::mmap_storage> *stor_local;
  disk_job_pool<libtorrent::aux::mmap_disk_job> *this_local;
  disk_job_flags_t flags_local;
  
  __m = &this->m_job_mutex;
  l._M_device = (mutex_type *)args_2;
  ::std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&ptr,__m);
  pmVar1 = (mmap_disk_job *)
           boost::object_pool<libtorrent::aux::mmap_disk_job,_libtorrent::aux::allocator_new_delete>
           ::malloc(&this->m_job_pool,(size_t)__m);
  local_48 = pmVar1;
  tailqueue_node<libtorrent::aux::disk_job>::tailqueue_node(&local_e0);
  local_d8._0_8_ = local_e0.next;
  local_d8[8] = flags.m_val;
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>::
  bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void> *)
                (local_d8 + 9));
  storage_error::storage_error((storage_error *)(local_d8 + 0x10));
  ::std::
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&)>
  ::function(&local_130.handler,args);
  local_130.piece.m_val = args_1->m_val;
  local_130.block_hashes.m_ptr =
       (digest32<256L> *)((l._M_device)->super___mutex_base)._M_mutex.__align;
  local_130.block_hashes.m_len =
       *(difference_type *)((long)&((l._M_device)->super___mutex_base)._M_mutex + 8);
  local_130.piece_hash.m_number._M_elems[4] = (args_3->m_number)._M_elems[4];
  local_130.piece_hash.m_number._M_elems._0_8_ = *(undefined8 *)(args_3->m_number)._M_elems;
  local_130.piece_hash.m_number._M_elems._8_8_ = *(undefined8 *)((args_3->m_number)._M_elems + 2);
  ::std::
  variant<libtorrent::aux::job::read,libtorrent::aux::job::write,libtorrent::aux::job::hash,libtorrent::aux::job::hash2,libtorrent::aux::job::move_storage,libtorrent::aux::job::release_files,libtorrent::aux::job::delete_files,libtorrent::aux::job::check_fastresume,libtorrent::aux::job::rename_file,libtorrent::aux::job::stop_torrent,libtorrent::aux::job::file_priority,libtorrent::aux::job::clear_piece,libtorrent::aux::job::partial_read>
  ::variant<libtorrent::aux::job::hash,void,void,libtorrent::aux::job::hash,void>
            ((variant<libtorrent::aux::job::read,libtorrent::aux::job::write,libtorrent::aux::job::hash,libtorrent::aux::job::hash2,libtorrent::aux::job::move_storage,libtorrent::aux::job::release_files,libtorrent::aux::job::delete_files,libtorrent::aux::job::check_fastresume,libtorrent::aux::job::rename_file,libtorrent::aux::job::stop_torrent,libtorrent::aux::job::file_priority,libtorrent::aux::job::clear_piece,libtorrent::aux::job::partial_read>
              *)(local_d8 + 0x28),&local_130);
  disk_job::disk_job((disk_job *)pmVar1,(disk_job *)local_d8);
  ::std::shared_ptr<libtorrent::aux::mmap_storage>::shared_ptr(&pmVar1->storage,stor);
  disk_job::~disk_job((disk_job *)local_d8);
  job::hash::~hash(&local_130);
  boost::object_pool<libtorrent::aux::mmap_disk_job,_libtorrent::aux::allocator_new_delete>::
  set_next_size(&this->m_job_pool,100);
  pmVar1 = local_48;
  this->m_jobs_in_use = this->m_jobs_in_use + 1;
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&ptr);
  return pmVar1;
}

Assistant:

T* allocate_job(
			disk_job_flags_t const flags
			, Storage stor
			, Args&&... args)
		{
			std::lock_guard<std::mutex> l(m_job_mutex);
			auto* ptr = m_job_pool.malloc();
			new (ptr) T{
				disk_job{
				tailqueue_node<disk_job>{},
				flags,
				status_t{},
				storage_error{},
				JobType{std::forward<Args>(args)...},
#if TORRENT_USE_ASSERTS
				true, // in_use
				false, // job_posted
				false, // callback_called
				false, // blocked
#endif
				},
				std::move(stor)};
			m_job_pool.set_next_size(100);
			++m_jobs_in_use;
			if constexpr (std::is_same_v<JobType, job::read>)
				++m_read_jobs;
			else if constexpr (std::is_same_v<JobType, job::write>)
				++m_write_jobs;

			return ptr;
		}